

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O1

cupdlp_int cupdlp_infNormIndex(CUPDLPwork *w,cupdlp_int n,cupdlp_float *x,cupdlp_int *res)

{
  ulong uVar1;
  cupdlp_int cVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  if (n < 1) {
    cVar2 = 0;
  }
  else {
    uVar1 = 0;
    dVar4 = 0.0;
    uVar3 = 0;
    do {
      dVar5 = ABS(x[uVar1]);
      if (dVar4 < dVar5) {
        uVar3 = uVar1 & 0xffffffff;
      }
      cVar2 = (cupdlp_int)uVar3;
      if (dVar5 <= dVar4) {
        dVar5 = dVar4;
      }
      dVar4 = dVar5;
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  *res = cVar2;
  return 0;
}

Assistant:

cupdlp_int nrminfindex(cupdlp_int n, const double *x, cupdlp_int incx) {
#ifdef USE_MY_BLAS
  assert(incx == 1);

  double nrm = 0.0;
  cupdlp_int index = 0;

  for (int i = 0; i < n; ++i) {
    double tmp = fabs(x[i]);
    if (tmp > nrm) {
      nrm = tmp;
      index = i;
    }
  }

  return index;
#else
  return dnrminfindex(n, x, incx);
#endif
}